

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O1

string * testing::internal::OutputFlagAlsoCheckEnvVar_abi_cxx11_(void)

{
  char *pcVar1;
  long *plVar2;
  size_type *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long *local_60 [2];
  long local_50 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)in_RDI,"");
  pcVar1 = getenv("XML_OUTPUT_FILE");
  if (pcVar1 != (char *)0x0) {
    local_60[0] = local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"xml:","");
    plVar2 = (long *)std::__cxx11::string::append((char *)local_60);
    psVar3 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar3) {
      local_40.field_2._M_allocated_capacity = *psVar3;
      local_40.field_2._8_8_ = plVar2[3];
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    }
    else {
      local_40.field_2._M_allocated_capacity = *psVar3;
      local_40._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_40._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_RDI,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if (local_60[0] != local_50) {
      operator_delete(local_60[0],local_50[0] + 1);
    }
  }
  return in_RDI;
}

Assistant:

std::string OutputFlagAlsoCheckEnvVar(){
  std::string default_value_for_output_flag = "";
  const char* xml_output_file_env = posix::GetEnv("XML_OUTPUT_FILE");
  if (nullptr != xml_output_file_env) {
    default_value_for_output_flag = std::string("xml:") + xml_output_file_env;
  }
  return default_value_for_output_flag;
}